

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O0

void __thiscall Sandbox::onPlot(Sandbox *this)

{
  byte bVar1;
  mapped_type pTVar2;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar3;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar4;
  bool bVar5;
  GLuint GVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  vec4 *pvVar11;
  mapped_type *ppTVar12;
  Texture *pTVar13;
  long lVar14;
  vec4 *pvVar15;
  double dVar16;
  vec<4,_float,_(glm::qualifier)0> vVar17;
  undefined8 in_stack_ffffffffffffed88;
  void *pvVar18;
  undefined4 uVar19;
  allocator local_11a1;
  string local_11a0;
  undefined8 local_1180;
  undefined8 local_1178;
  int local_1170;
  allocator local_1169;
  int i_3;
  allocator local_1141;
  string local_1140;
  undefined8 local_1120;
  undefined8 local_1118;
  int local_1110;
  allocator local_1109;
  int i_2;
  allocator local_10e1;
  string local_10e0;
  allocator local_10b9;
  key_type local_10b8;
  vec<4,_float,_(glm::qualifier)0> local_1094;
  vec<4,_float,_(glm::qualifier)0> local_1084;
  int local_1074;
  int local_1070;
  int i_1;
  int luma;
  int i;
  vec4 freqs [256];
  float max_luma_freq;
  float max_rgb_freq;
  uchar *pixels;
  int total;
  int c;
  int h;
  int w;
  allocator local_31;
  string local_30;
  Sandbox *local_10;
  Sandbox *this_local;
  
  uVar19 = (undefined4)((ulong)in_stack_ffffffffffffed88 >> 0x20);
  local_10 = this;
  bVar5 = vera::Fbo::isAllocated(&(this->m_sceneRender).renderFbo);
  if (bVar5) {
    if (((((this->m_plot == PLOT_LUMA) || (this->m_plot == PLOT_RGB)) || (this->m_plot == PLOT_RED))
        || ((this->m_plot == PLOT_GREEN || (this->m_plot == PLOT_BLUE)))) &&
       (bVar5 = haveChange(this), bVar5)) {
      bVar5 = Tracker::isRunning(&(this->uniforms).tracker);
      if (bVar5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_30,"plot::histogram",&local_31);
        Tracker::begin(&(this->uniforms).tracker,&local_30);
        std::__cxx11::string::~string((string *)&local_30);
        std::allocator<char>::~allocator((allocator<char> *)&local_31);
      }
      GVar6 = vera::Fbo::getId(&(this->m_sceneRender).renderFbo);
      glBindFramebuffer(0x8d40,GVar6);
      iVar7 = vera::getWindowWidth();
      iVar8 = vera::getWindowHeight();
      iVar9 = iVar7 * iVar8 * 3;
      pvVar10 = operator_new__((long)iVar9);
      pvVar18 = pvVar10;
      glReadPixels(0,0,iVar7,iVar8,0x1907,0x1401,pvVar10);
      glBindFramebuffer(0x8d40,0);
      freqs[0xff].field_3.w = 0.0;
      freqs[0xff].field_2.z = 0.0;
      for (i_1 = 0; i_1 < iVar9; i_1 = i_1 + 3) {
        this->m_plot_values[*(byte *)((long)pvVar10 + (long)i_1)].field_0.x =
             this->m_plot_values[*(byte *)((long)pvVar10 + (long)i_1)].field_0.x + 1.0;
        if (freqs[0xff].field_3.w <
            this->m_plot_values[*(byte *)((long)pvVar10 + (long)i_1)].field_0.x) {
          freqs[0xff].field_3 =
               *(anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                (this->m_plot_values + *(byte *)((long)pvVar10 + (long)i_1));
        }
        bVar1 = *(byte *)((long)pvVar10 + (long)(i_1 + 1));
        this->m_plot_values[bVar1].field_1.y = this->m_plot_values[bVar1].field_1.y + 1.0;
        if (freqs[0xff].field_3.w <
            this->m_plot_values[*(byte *)((long)pvVar10 + (long)(i_1 + 1))].field_1.y) {
          freqs[0xff].field_3 =
               *(anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                &this->m_plot_values[*(byte *)((long)pvVar10 + (long)(i_1 + 1))].field_1;
        }
        bVar1 = *(byte *)((long)pvVar10 + (long)(i_1 + 2));
        this->m_plot_values[bVar1].field_2.z = this->m_plot_values[bVar1].field_2.z + 1.0;
        if (freqs[0xff].field_3.w <
            this->m_plot_values[*(byte *)((long)pvVar10 + (long)(i_1 + 2))].field_2.z) {
          freqs[0xff].field_3 =
               *(anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                &this->m_plot_values[*(byte *)((long)pvVar10 + (long)(i_1 + 2))].field_2;
        }
        local_1070 = (int)((double)*(byte *)((long)pvVar10 + (long)(i_1 + 2)) * 0.114 +
                          (double)*(byte *)((long)pvVar10 + (long)i_1) * 0.299 +
                          (double)*(byte *)((long)pvVar10 + (long)(i_1 + 1)) * 0.587);
        this->m_plot_values[local_1070].field_3.w = this->m_plot_values[local_1070].field_3.w + 1.0;
        if (freqs[0xff].field_2.z < this->m_plot_values[local_1070].field_3.w) {
          freqs[0xff].field_2 =
               *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
                &this->m_plot_values[local_1070].field_3;
        }
      }
      if (pvVar10 != (void *)0x0) {
        operator_delete__(pvVar10);
      }
      for (local_1074 = 0; uVar19 = (undefined4)((ulong)pvVar18 >> 0x20), local_1074 < 0x100;
          local_1074 = local_1074 + 1) {
        lVar14 = (long)local_1074;
        glm::vec<4,_float,_(glm::qualifier)0>::vec
                  (&local_1094,freqs[0xff].field_3.w,freqs[0xff].field_3.w,freqs[0xff].field_3.w,
                   freqs[0xff].field_2.z);
        vVar17 = glm::operator/(this->m_plot_values + lVar14,&local_1094);
        pvVar11 = this->m_plot_values + local_1074;
        local_1084._0_8_ = vVar17._0_8_;
        pvVar11->field_0 = local_1084.field_0;
        pvVar11->field_1 = local_1084.field_1;
        local_1084._8_8_ = vVar17._8_8_;
        pvVar11->field_2 = local_1084.field_2;
        pvVar11->field_3 = local_1084.field_3;
        local_1084 = vVar17;
      }
      if (this->m_plot_texture == (Texture *)0x0) {
        pTVar13 = (Texture *)operator_new(0x48);
        vera::Texture::Texture(pTVar13);
        this->m_plot_texture = pTVar13;
      }
      (*this->m_plot_texture->_vptr_Texture[6])
                (this->m_plot_texture,0x100,1,4,0x20,this->m_plot_values,CONCAT44(uVar19,1),1);
      pTVar2 = this->m_plot_texture;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_10b8,"u_histogram",&local_10b9);
      ppTVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                 ::operator[](&(this->uniforms).super_Scene.textures,&local_10b8);
      *ppTVar12 = pTVar2;
      std::__cxx11::string::~string((string *)&local_10b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_10b9);
      Uniforms::flagChange(&this->uniforms);
      bVar5 = Tracker::isRunning(&(this->uniforms).tracker);
      if (bVar5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_10e0,"plot::histogram",&local_10e1);
        Tracker::end(&(this->uniforms).tracker,&local_10e0);
        std::__cxx11::string::~string((string *)&local_10e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_10e1);
      }
    }
    else if (this->m_plot == PLOT_FPS) {
      bVar5 = Tracker::isRunning(&(this->uniforms).tracker);
      if (bVar5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&i_2,"plot::fps",&local_1109);
        Tracker::begin(&(this->uniforms).tracker,(string *)&i_2);
        std::__cxx11::string::~string((string *)&i_2);
        std::allocator<char>::~allocator((allocator<char> *)&local_1109);
      }
      for (local_1110 = 0; local_1110 < 0xff; local_1110 = local_1110 + 1) {
        pvVar15 = this->m_plot_values + (local_1110 + 1);
        pvVar11 = this->m_plot_values + local_1110;
        aVar3 = pvVar15->field_1;
        pvVar11->field_0 = pvVar15->field_0;
        pvVar11->field_1 = aVar3;
        aVar4 = pvVar15->field_3;
        pvVar11->field_2 = pvVar15->field_2;
        pvVar11->field_3 = aVar4;
      }
      dVar16 = vera::getFps();
      glm::vec<4,float,(glm::qualifier)0>::vec<double,float,float,float>
                ((vec<4,float,(glm::qualifier)0> *)&local_1120,dVar16 / 60.0,0.0,0.0,1.0);
      this->m_plot_values[0xff].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_1120;
      this->m_plot_values[0xff].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_1120._4_4_;
      this->m_plot_values[0xff].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)local_1118;
      this->m_plot_values[0xff].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_1118._4_4_;
      if (this->m_plot_texture == (Texture *)0x0) {
        pTVar13 = (Texture *)operator_new(0x48);
        vera::Texture::Texture(pTVar13);
        this->m_plot_texture = pTVar13;
      }
      (*this->m_plot_texture->_vptr_Texture[6])
                (this->m_plot_texture,0x100,1,4,0x20,this->m_plot_values,CONCAT44(uVar19,1),1);
      bVar5 = Tracker::isRunning(&(this->uniforms).tracker);
      if (bVar5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1140,"plot::fps",&local_1141);
        Tracker::end(&(this->uniforms).tracker,&local_1140);
        std::__cxx11::string::~string((string *)&local_1140);
        std::allocator<char>::~allocator((allocator<char> *)&local_1141);
      }
    }
    else if (this->m_plot == PLOT_MS) {
      bVar5 = Tracker::isRunning(&(this->uniforms).tracker);
      if (bVar5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&i_3,"plot::ms",&local_1169);
        Tracker::begin(&(this->uniforms).tracker,(string *)&i_3);
        std::__cxx11::string::~string((string *)&i_3);
        std::allocator<char>::~allocator((allocator<char> *)&local_1169);
      }
      for (local_1170 = 0; local_1170 < 0xff; local_1170 = local_1170 + 1) {
        pvVar15 = this->m_plot_values + (local_1170 + 1);
        pvVar11 = this->m_plot_values + local_1170;
        aVar3 = pvVar15->field_1;
        pvVar11->field_0 = pvVar15->field_0;
        pvVar11->field_1 = aVar3;
        aVar4 = pvVar15->field_3;
        pvVar11->field_2 = pvVar15->field_2;
        pvVar11->field_3 = aVar4;
      }
      dVar16 = vera::getDelta();
      glm::vec<4,float,(glm::qualifier)0>::vec<double,float,float,float>
                ((vec<4,float,(glm::qualifier)0> *)&local_1180,dVar16,0.0,0.0,1.0);
      this->m_plot_values[0xff].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_1180;
      this->m_plot_values[0xff].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_1180._4_4_;
      this->m_plot_values[0xff].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)local_1178;
      this->m_plot_values[0xff].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_1178._4_4_;
      if (this->m_plot_texture == (Texture *)0x0) {
        pTVar13 = (Texture *)operator_new(0x48);
        vera::Texture::Texture(pTVar13);
        this->m_plot_texture = pTVar13;
      }
      (*this->m_plot_texture->_vptr_Texture[6])
                (this->m_plot_texture,0x100,1,4,0x20,this->m_plot_values,CONCAT44(uVar19,1),1);
      bVar5 = Tracker::isRunning(&(this->uniforms).tracker);
      if (bVar5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_11a0,"plot::ms",&local_11a1);
        Tracker::end(&(this->uniforms).tracker,&local_11a0);
        std::__cxx11::string::~string((string *)&local_11a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_11a1);
      }
    }
  }
  return;
}

Assistant:

void Sandbox::onPlot() {
    // if ( !vera::isGL() )
    //     return;
    if (!m_sceneRender.renderFbo.isAllocated())
        return;

    if ( (m_plot == PLOT_LUMA || m_plot == PLOT_RGB || m_plot == PLOT_RED || m_plot == PLOT_GREEN || m_plot == PLOT_BLUE ) && haveChange() ) {
        TRACK_BEGIN("plot::histogram")


        // Extract pixels
        glBindFramebuffer(GL_FRAMEBUFFER, m_sceneRender.renderFbo.getId());
        int w = vera::getWindowWidth();
        int h = vera::getWindowHeight();
        int c = 3;
        int total = w * h * c;
        unsigned char* pixels = new unsigned char[total];
        glReadPixels(0, 0, w, h, GL_RGB, GL_UNSIGNED_BYTE, pixels);
        glBindFramebuffer(GL_FRAMEBUFFER, 0);

        // Count frequencies of appearances 
        float max_rgb_freq = 0;
        float max_luma_freq = 0;
        glm::vec4 freqs[256];
        for (int i = 0; i < total; i += c) {
            m_plot_values[pixels[i]].r++;
            if (m_plot_values[pixels[i]].r > max_rgb_freq)
                max_rgb_freq = m_plot_values[pixels[i]].r;

            m_plot_values[pixels[i+1]].g++;
            if (m_plot_values[pixels[i+1]].g > max_rgb_freq)
                max_rgb_freq = m_plot_values[pixels[i+1]].g;

            m_plot_values[pixels[i+2]].b++;
            if (m_plot_values[pixels[i+2]].b > max_rgb_freq)
                max_rgb_freq = m_plot_values[pixels[i+2]].b;

            int luma = 0.299 * pixels[i] + 0.587 * pixels[i+1] + 0.114 * pixels[i+2];
            m_plot_values[luma].a++;
            if (m_plot_values[luma].a > max_luma_freq)
                max_luma_freq = m_plot_values[luma].a;
        }
        delete[] pixels;

        // Normalize frequencies
        for (int i = 0; i < 256; i ++)
            m_plot_values[i] = m_plot_values[i] / glm::vec4(max_rgb_freq, max_rgb_freq, max_rgb_freq, max_luma_freq);

        if (m_plot_texture == nullptr)
            m_plot_texture = new vera::Texture();
        m_plot_texture->load(256, 1, 4, 32, &m_plot_values[0], vera::NEAREST, vera::CLAMP);

        uniforms.textures["u_histogram"] = m_plot_texture;
        uniforms.flagChange();
        TRACK_END("plot::histogram")
    }

    else if (m_plot == PLOT_FPS ) {
        TRACK_BEGIN("plot::fps")

        // Push back values one position
        for (int i = 0; i < 255; i ++)
            m_plot_values[i] = m_plot_values[i+1];
        m_plot_values[255] = glm::vec4( vera::getFps()/60.0f, 0.0f, 0.0f, 1.0f);

        if (m_plot_texture == nullptr)
            m_plot_texture = new vera::Texture();

        m_plot_texture->load(256, 1, 4, 32, &m_plot_values[0], vera::NEAREST, vera::CLAMP);
        // uniforms.textures["u_sceneFps"] = m_plot_texture;

        TRACK_END("plot::fps")
    }

    else if (m_plot == PLOT_MS ) {
        TRACK_BEGIN("plot::ms")

        // Push back values one position
        for (int i = 0; i < 255; i ++)
            m_plot_values[i] = m_plot_values[i+1];
        m_plot_values[255] = glm::vec4( vera::getDelta(), 0.0f, 0.0f, 1.0f);

        if (m_plot_texture == nullptr)
            m_plot_texture = new vera::Texture();

        m_plot_texture->load(256, 1, 4, 32, &m_plot_values[0], vera::NEAREST, vera::CLAMP);

        // uniforms.textures["u_sceneMs"] = m_plot_texture;

        TRACK_END("plot::ms")
    }
}